

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

vector<Image,_std::allocator<Image>_> *
getContainerImages(vector<Image,_std::allocator<Image>_> *__return_storage_ptr__,string *rootDir)

{
  recursive_directory_iterator *this;
  pointer pcVar1;
  size_type sVar2;
  ulong uVar3;
  path *ppVar4;
  long lVar5;
  char *__s;
  undefined8 uVar6;
  path *__p;
  undefined1 local_208 [8];
  stat attr;
  recursive_directory_iterator local_168;
  string local_158;
  undefined1 auStack_138 [8];
  recursive_directory_iterator __end1;
  string local_120;
  undefined1 local_100 [8];
  string lastModified;
  recursive_directory_iterator __begin1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_c0;
  size_type *local_b0;
  string imageId;
  element_type *local_88;
  undefined1 local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  vector<Image,_std::allocator<Image>_> *local_38;
  
  (__return_storage_ptr__->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80 = (undefined1  [8])&__str._M_string_length;
  pcVar1 = (rootDir->_M_dataplus)._M_p;
  local_38 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,pcVar1,pcVar1 + rootDir->_M_string_length);
  std::__cxx11::string::append(local_80);
  std::filesystem::__cxx11::path::path((path *)local_208,(string_type *)local_80,auto_format);
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)((long)&imageId.field_2 + 8),(path *)local_208,none,
             (error_code *)0x0);
  std::filesystem::__cxx11::path::~path((path *)local_208);
  if (local_80 != (undefined1  [8])&__str._M_string_length) {
    operator_delete((void *)local_80,__str._M_string_length + 1);
  }
  if (local_88 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_88 + 8) = *(int *)(local_88 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_88 + 8) = *(int *)(local_88 + 8) + 1;
    }
  }
  lastModified.field_2._8_8_ = imageId.field_2._8_8_;
  __begin1._M_dirs._M_ptr = local_88;
  attr.__glibc_reserved[2] = 0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)(attr.__glibc_reserved + 2));
  local_168._M_dirs._M_ptr = (element_type *)imageId.field_2._8_8_;
  if (local_88 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_88 + 8) = *(int *)(local_88 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_88 + 8) = *(int *)(local_88 + 8) + 1;
    }
  }
  auStack_138 = (undefined1  [8])0x0;
  __end1._M_dirs._M_ptr = (element_type *)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_168);
  this = (recursive_directory_iterator *)((long)&lastModified.field_2 + 8);
  do {
    if (__begin1._M_dirs._M_ptr == __end1._M_dirs._M_ptr) {
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)auStack_138);
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)((long)&lastModified.field_2 + 8));
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)((long)&imageId.field_2 + 8));
      return local_38;
    }
    ppVar4 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*(this);
    sVar2 = (ppVar4->_M_pathname)._M_string_length;
    if (sVar2 == 0) {
LAB_0010ba54:
      std::filesystem::__cxx11::path::path((path *)local_208);
    }
    else {
      uVar3 = *(ulong *)&ppVar4->_M_cmpts;
      __p = ppVar4;
      if ((~(byte)uVar3 & 3) != 0) {
        if (((uVar3 & 3) == 0) && ((ppVar4->_M_pathname)._M_dataplus._M_p[sVar2 - 1] != '/')) {
          if ((uVar3 & 3) == 0) {
            lVar5 = std::filesystem::__cxx11::path::_List::end();
          }
          else {
            lVar5 = 0;
          }
          if (((byte)ppVar4->_M_cmpts & 3) == 0) {
            __p = (path *)(lVar5 + -0x30);
          }
          if ((~*(uint *)&__p->_M_cmpts & 3) == 0) goto LAB_0010ba46;
        }
        goto LAB_0010ba54;
      }
LAB_0010ba46:
      std::filesystem::__cxx11::path::path((path *)local_208,__p);
    }
    __begin1._M_dirs._M_refcount._M_pi = &local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__begin1._M_dirs._M_refcount,local_208,
               (pointer)((long)local_208 + attr.st_dev));
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,".","");
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_80,(string *)&__begin1._M_dirs._M_refcount,&local_120);
    local_b0 = &imageId._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,*(size_type *)local_80,
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)local_80 + 8))->_M_allocated_capacity + *(size_type *)local_80);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (__begin1._M_dirs._M_refcount._M_pi != &local_c0) {
      operator_delete(__begin1._M_dirs._M_refcount._M_pi,(long)local_c0._vptr__Sp_counted_base + 1);
    }
    std::filesystem::__cxx11::path::~path((path *)local_208);
    memset((stat *)local_208,0,0x90);
    stat((ppVar4->_M_pathname)._M_dataplus._M_p,(stat *)local_208);
    __s = ctime(&attr.st_atim.tv_nsec);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,__s,(allocator<char> *)local_80);
    trimEnd((string *)local_100,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    uVar6 = std::filesystem::file_size(ppVar4);
    local_80 = (undefined1  [8])&__str._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,local_b0,imageId._M_dataplus._M_p + (long)local_b0);
    __str.field_2._8_8_ = uVar6;
    local_58._M_p = (pointer)&local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,local_100,lastModified._M_dataplus._M_p + (long)local_100);
    std::vector<Image,_std::allocator<Image>_>::emplace_back<Image>(local_38,(Image *)local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_p != &local_48) {
      operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
    }
    if (local_80 != (undefined1  [8])&__str._M_string_length) {
      operator_delete((void *)local_80,__str._M_string_length + 1);
    }
    if (local_100 != (undefined1  [8])&lastModified._M_string_length) {
      operator_delete((void *)local_100,lastModified._M_string_length + 1);
    }
    if (local_b0 != &imageId._M_string_length) {
      operator_delete(local_b0,imageId._M_string_length + 1);
    }
    std::filesystem::__cxx11::recursive_directory_iterator::operator++(this);
  } while( true );
}

Assistant:

std::vector<Image> getContainerImages(const std::string& rootDir)
{
    std::vector<Image> images;
    for (const auto& archive : std::filesystem::recursive_directory_iterator(rootDir + "/images"))
    {
        std::string imageId = split(archive.path().filename(), ".")[0];
        // Obtains the time at which the file was last modified
        struct stat attr{};
        stat(archive.path().c_str(), &attr);
        std::string lastModified(trimEnd(ctime(&attr.st_mtime)));

        uintmax_t fileSize = std::filesystem::file_size(archive);
        images.emplace_back(Image { imageId, fileSize, lastModified });
    }
    return images;
}